

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void __thiscall
kratos::ZeroGeneratorInputVisitor::visit(ZeroGeneratorInputVisitor *this,Generator *generator)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  uint uVar2;
  long *plVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  _Base_ptr p_Var9;
  uint uVar10;
  pointer puVar11;
  long *plVar12;
  pointer psVar13;
  pointer psVar14;
  undefined1 local_150 [8];
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  attributes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  bits;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  children;
  _Any_data local_b0;
  element_type *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined1 local_90 [8];
  function<void_(unsigned_int,_unsigned_int)> wire_zero;
  shared_ptr<kratos::Port> port;
  uint *puStack_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> diff_bits;
  uint local_34;
  
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
          *)local_150,&(generator->super_IRNode).attributes_);
  if (local_150 !=
      (undefined1  [8])
      attributes.
      super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar5 = false;
    do {
      psVar13 = (pointer)((long)local_150 + 0x10);
      iVar6 = std::__cxx11::string::compare
                        ((char *)&((((pointer)local_150)->
                                   super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->type_str);
      if (iVar6 == 0) {
        bVar5 = true;
        break;
      }
      local_150 = (undefined1  [8])psVar13;
    } while (psVar13 !=
             attributes.
             super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
    if (bVar5) {
      Generator::get_child_generators
                ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  *)&bits._M_h._M_single_bucket,generator);
      for (psVar14 = (pointer)bits._M_h._M_single_bucket;
          psVar14 !=
          children.
          super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ._M_impl.super__Vector_impl_data._M_start; psVar14 = psVar14 + 1) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&attributes.
                       super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   &(((psVar14->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->ports_)._M_t);
        p_Var9 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
            (_Base_ptr)&port_names) {
          do {
            Generator::get_port((Generator *)&wire_zero._M_invoker,
                                (string *)
                                (psVar14->
                                super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
            if (*(int *)(wire_zero._M_invoker + 0x270) != 1) {
              bits._M_h._M_buckets = (__buckets_ptr)0x1;
              bits._M_h._M_bucket_count = 0;
              bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
              bits._M_h._M_element_count._0_4_ = 0x3f800000;
              bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
              bits._M_h._M_rehash_policy._4_4_ = 0;
              bits._M_h._M_rehash_policy._M_next_resize = 0;
              port_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)&bits._M_h._M_rehash_policy._M_next_resize;
              bVar5 = connected((shared_ptr<kratos::Port> *)&wire_zero._M_invoker,
                                (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
              if (!bVar5) {
                puStack_58 = (uint *)0x0;
                diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                uVar10 = 0;
                while (local_90._0_4_ = uVar10,
                      uVar7 = (**(code **)(*(long *)wire_zero._M_invoker + 0x38))(), uVar10 < uVar7)
                {
                  plVar3 = *(long **)(port_names._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                     ((ulong)(uint)local_90._0_4_ % (ulong)bits._M_h._M_buckets) * 8
                                     );
                  plVar8 = (long *)0x0;
                  if ((plVar3 != (long *)0x0) &&
                     (plVar8 = plVar3, plVar12 = (long *)*plVar3,
                     local_90._0_4_ != *(uint *)((long *)*plVar3 + 1))) {
                    while (plVar3 = (long *)*plVar12, plVar3 != (long *)0x0) {
                      plVar8 = (long *)0x0;
                      if (((ulong)*(uint *)(plVar3 + 1) % (ulong)bits._M_h._M_buckets !=
                           (ulong)(uint)local_90._0_4_ % (ulong)bits._M_h._M_buckets) ||
                         (plVar8 = plVar12, plVar12 = plVar3,
                         local_90._0_4_ == *(uint *)(plVar3 + 1))) goto LAB_00229601;
                    }
                    plVar8 = (long *)0x0;
                  }
LAB_00229601:
                  if ((plVar8 == (long *)0x0) || (*plVar8 == 0)) {
                    if (diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start ==
                        diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
                      std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int&>
                                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&puStack_58,
                                 (iterator)
                                 diff_bits.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start,(uint *)local_90);
                    }
                    else {
                      *diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start = local_90._0_4_;
                      diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1;
                    }
                  }
                  uVar10 = local_90._0_4_ + 1;
                }
                uVar10 = *puStack_58;
                local_b0._M_unused._M_function_pointer = (_func_void *)wire_zero._M_invoker;
                local_b0._8_8_ =
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    pvVar1 = &((port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_Var).super_IRNode.fn_name_ln;
                    *(int *)&(pvVar1->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_start =
                         *(int *)&(pvVar1->
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1;
                    UNLOCK();
                  }
                  else {
                    pvVar1 = &((port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_Var).super_IRNode.fn_name_ln;
                    *(int *)&(pvVar1->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_start =
                         *(int *)&(pvVar1->
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1;
                  }
                }
                local_a0 = (psVar14->
                           super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                ;
                local_98 = (psVar14->
                           super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi;
                if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_98->_M_use_count = local_98->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_98->_M_use_count = local_98->_M_use_count + 1;
                  }
                }
                std::function<void(unsigned_int,unsigned_int)>::
                function<kratos::ZeroGeneratorInputVisitor::visit(kratos::Generator*)::_lambda(unsigned_int,unsigned_int)_1_,void>
                          ((function<void(unsigned_int,unsigned_int)> *)local_90,
                           (anon_class_32_2_644a8d91 *)&local_b0);
                if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
                }
                puVar11 = puStack_58;
                uVar7 = uVar10;
                puVar4 = diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if ((element_type *)local_b0._8_8_ != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
                  puVar11 = puStack_58;
                  puVar4 = diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                }
                for (; local_34 = uVar10, puVar11 != puVar4; puVar11 = puVar11 + 1) {
                  uVar2 = *puVar11;
                  if (1 < uVar2 - uVar7) {
                    local_b0._0_4_ = uVar7;
                    if (wire_zero.super__Function_base._M_functor._8_8_ == 0) {
                      std::__throw_bad_function_call();
                    }
                    (*wire_zero.super__Function_base._M_manager)
                              ((_Any_data *)local_90,&local_b0,(_Manager_operation)&local_34);
                    uVar10 = uVar2;
                  }
                  uVar7 = uVar2;
                }
                local_b0._0_4_ = uVar7;
                if (wire_zero.super__Function_base._M_functor._8_8_ == 0) {
                  std::__throw_bad_function_call();
                }
                (*wire_zero.super__Function_base._M_manager)
                          ((_Any_data *)local_90,&local_b0,(_Manager_operation)&local_34);
                if (wire_zero.super__Function_base._M_functor._8_8_ != 0) {
                  (*(code *)wire_zero.super__Function_base._M_functor._8_8_)(local_90,local_90,3);
                }
                if (puStack_58 != (uint *)0x0) {
                  operator_delete(puStack_58,
                                  (long)diff_bits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)puStack_58);
                }
              }
              std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
            if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != (_Rb_tree_node_base *)&port_names);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&attributes.
                        super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                 *)&bits._M_h._M_single_bucket);
    }
  }
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           *)local_150);
  return;
}

Assistant:

void visit(Generator* generator) override {
        // we only do that with generator that has attributes called "zero_inputs"
        // we don't care about the values
        auto attributes = generator->get_attributes();
        bool has_attribute = false;
        if (!attributes.empty()) {
            for (auto const& attr : attributes) {
                if (attr->type_str == "zero_inputs") {
                    has_attribute = true;
                    break;
                }
            }
        }
        if (has_attribute) {
            // compute unconnected
            // check each child generator
            auto children = generator->get_child_generators();
            for (auto const& gen : children) {
                auto port_names = gen->get_port_names();
                for (auto const& port_name : port_names) {
                    auto port = gen->get_port(port_name);
                    if (port->port_direction() == PortDirection::Out) continue;
                    std::unordered_set<uint32_t> bits;
                    bool is_connected = connected(port, bits);
                    if (!is_connected) {
                        // notice that we can two choices here:
                        // bit wiring and bulk wiring
                        // we will implement bulk wiring here since the merge wiring pass is not
                        // complete at the time of implementation
                        // compute the set difference
                        std::vector<uint32_t> diff_bits;
                        for (uint32_t i = 0; i < port->width(); i++) {
                            if (bits.find(i) == bits.end()) {
                                // no need to sort the bits since we're going in order
                                // so it's already sorted.
                                diff_bits.emplace_back(i);
                            }
                        }
                        // we will connect the size 1 easily
                        // however, if it's an array and sliced in a weird way, there is nothing
                        // easy we can do. for now we will throw an exception
                        // maximum the slices range
                        uint32_t low = diff_bits[0];
                        uint32_t high = low;
                        uint32_t pre_high = high;

                        // lambda functions to handle the situation
                        std::function<void(uint32_t, uint32_t)> wire_zero = [=](uint32_t h,
                                                                                uint32_t l) {
                            uint32_t ll, hh;
                            if (port->size().size() == 1 && port->size().front() == 1) {
                                ll = l;
                                hh = h;
                            } else {
                                if (l % port->var_width() || (h + 1) % port->var_width()) {
                                    // can't handle it right now
                                    auto stmts = std::vector<Stmt*>();
                                    stmts.reserve(port->sources().size());
                                    for (auto const& stmt : port->sources()) {
                                        stmts.emplace_back(stmt.get());
                                    }
                                    throw StmtException(
                                        "Cannot fix up unpacked array due to irregular slicing",
                                        stmts.begin(), stmts.end());
                                }
                                // compute the low and high
                                ll = l / port->var_width();
                                hh = h / port->var_width();
                            }
                            std::shared_ptr<AssignStmt> stmt;
                            // a special case is that the port is not connected at all!
                            if (ll == 0 && hh == (port->width() - 1)) {
                                stmt = port->assign(constant(0, port->width(), port->is_signed()));
                            } else {
                                auto& slice = port->operator[]({hh, ll});
                                stmt = slice.assign(constant(0, slice.width(), slice.is_signed()));
                            }
                            stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
                            gen->add_stmt(stmt);
                        };

                        for (auto const bit : diff_bits) {
                            high = bit;
                            if (high - pre_high > 1) {
                                // there is a gap
                                wire_zero(pre_high, low);
                                low = high;
                                pre_high = low;
                            } else {
                                pre_high = high;
                            }
                        }
                        // the last bit
                        wire_zero(high, low);
                    }
                }
            }
        }
    }